

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::RepeatedPrimitiveFieldGenerator::GenerateSerializedSizeCode
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  JavaType type;
  FieldOptions *this_00;
  Printer *printer_local;
  RepeatedPrimitiveFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ != null && this.$name$.length > 0) {\n");
  io::Printer::Indent(printer);
  GenerateRepeatedDataSizeCode(this,printer);
  io::Printer::Print(printer,"size += dataSize;\n");
  bVar1 = FieldDescriptor::is_packable(this->descriptor_);
  if (bVar1) {
    this_00 = FieldDescriptor::options(this->descriptor_);
    bVar1 = FieldOptions::packed(this_00);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "size += $tag_size$;\nsize += com.google.protobuf.nano.CodedOutputByteBufferNano\n    .computeRawVarint32Size(dataSize);\n"
                        );
      goto LAB_00489538;
    }
  }
  type = GetJavaType(this->descriptor_);
  bVar1 = anon_unknown_5::IsReferenceType(type);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"size += $tag_size$ * dataCount;\n");
  }
  else {
    io::Printer::Print(printer,&this->variables_,"size += $tag_size$ * this.$name$.length;\n");
  }
LAB_00489538:
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ != null && this.$name$.length > 0) {\n");
  printer->Indent();

  GenerateRepeatedDataSizeCode(printer);

  printer->Print(
    "size += dataSize;\n");
  if (descriptor_->is_packable() && descriptor_->options().packed()) {
    printer->Print(variables_,
      "size += $tag_size$;\n"
      "size += com.google.protobuf.nano.CodedOutputByteBufferNano\n"
      "    .computeRawVarint32Size(dataSize);\n");
  } else if (IsReferenceType(GetJavaType(descriptor_))) {
    printer->Print(variables_,
      "size += $tag_size$ * dataCount;\n");
  } else {
    printer->Print(variables_,
      "size += $tag_size$ * this.$name$.length;\n");
  }

  printer->Outdent();

  printer->Print(
    "}\n");
}